

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageBindingLayerCase::iterate
          (ImageBindingLayerCase *this)

{
  deUint32 *pdVar1;
  deUint32 *pdVar2;
  TestLog *pTVar3;
  int iVar4;
  GLenum GVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar6;
  undefined4 extraout_var_01;
  int maxImages;
  ScopedLogSection section;
  Texture textureA;
  CallLogWrapper gl;
  Texture textureB;
  ResultCollector result;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar4),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pdVar1 = &textureA.super_ObjectWrapper.m_object;
  textureA.super_ObjectWrapper.m_gl = (Functions *)pdVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&textureA," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&result,pTVar3,(string *)&textureA);
  if (textureA.super_ObjectWrapper.m_gl != (Functions *)pdVar1) {
    operator_delete(textureA.super_ObjectWrapper.m_gl,
                    CONCAT44(textureA.super_ObjectWrapper._20_4_,
                             textureA.super_ObjectWrapper.m_object) + 1);
  }
  maxImages = -1;
  gl.m_enableLog = true;
  glu::CallLogWrapper::glGetIntegerv(&gl,0x8f38,&maxImages);
  GVar5 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar5,"glGetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x2b2);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  textureA.super_ObjectWrapper.m_gl = (Functions *)pdVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&textureA,"Initial","");
  pdVar2 = &textureB.super_ObjectWrapper.m_object;
  textureB.super_ObjectWrapper.m_gl = (Functions *)pdVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&textureB,"Initial value","");
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar3,(string *)&textureA,(string *)&textureB);
  if (textureB.super_ObjectWrapper.m_gl != (Functions *)pdVar2) {
    operator_delete(textureB.super_ObjectWrapper.m_gl,
                    CONCAT44(textureB.super_ObjectWrapper._20_4_,
                             textureB.super_ObjectWrapper.m_object) + 1);
  }
  if (textureA.super_ObjectWrapper.m_gl != (Functions *)pdVar1) {
    operator_delete(textureA.super_ObjectWrapper.m_gl,
                    CONCAT44(textureA.super_ObjectWrapper._20_4_,
                             textureA.super_ObjectWrapper.m_object) + 1);
  }
  if (0 < maxImages) {
    iVar4 = 0;
    do {
      deqp::gls::StateQueryUtil::verifyStateIndexedInteger
                (&result,&gl,0x8f3d,iVar4,0,this->m_verifierType);
      iVar4 = iVar4 + 1;
    } while (iVar4 < maxImages);
  }
  tcu::TestLog::endSection(section.m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  textureA.super_ObjectWrapper.m_gl = (Functions *)pdVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&textureA,"AfterSetting","");
  textureB.super_ObjectWrapper.m_gl = (Functions *)pdVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&textureB,"After setting","");
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar3,(string *)&textureA,(string *)&textureB);
  if (textureB.super_ObjectWrapper.m_gl != (Functions *)pdVar2) {
    operator_delete(textureB.super_ObjectWrapper.m_gl,
                    CONCAT44(textureB.super_ObjectWrapper._20_4_,
                             textureB.super_ObjectWrapper.m_object) + 1);
  }
  if (textureA.super_ObjectWrapper.m_gl != (Functions *)pdVar1) {
    operator_delete(textureA.super_ObjectWrapper.m_gl,
                    CONCAT44(textureA.super_ObjectWrapper._20_4_,
                             textureA.super_ObjectWrapper.m_object) + 1);
  }
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar6 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper
            (&textureA.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_00,iVar4),pOVar6);
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar6 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper
            (&textureB.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_01,iVar4),pOVar6);
  iVar4 = maxImages;
  glu::CallLogWrapper::glBindTexture(&gl,0xde1,textureA.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glTexStorage2D(&gl,0xde1,1,0x8058,0x20,0x20);
  GVar5 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar5,"gen tex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x2c4);
  glu::CallLogWrapper::glBindImageTexture
            (&gl,0,textureA.super_ObjectWrapper.m_object,0,'\0',0,35000,0x8d7c);
  GVar5 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar5,"bind unit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x2c7);
  glu::CallLogWrapper::glBindTexture(&gl,0x8c1a,textureB.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glTexStorage3D(&gl,0x8c1a,1,0x8058,0x20,0x20,4);
  GVar5 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar5,"gen tex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x2cb);
  glu::CallLogWrapper::glBindImageTexture
            (&gl,iVar4 / 2,textureB.super_ObjectWrapper.m_object,0,'\x01',2,35000,0x8d7c);
  GVar5 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar5,"bind unit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x2ce);
  deqp::gls::StateQueryUtil::verifyStateIndexedInteger(&result,&gl,0x8f3d,0,0,this->m_verifierType);
  deqp::gls::StateQueryUtil::verifyStateIndexedInteger
            (&result,&gl,0x8f3d,iVar4 / 2,2,this->m_verifierType);
  glu::ObjectWrapper::~ObjectWrapper(&textureB.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&textureA.super_ObjectWrapper);
  tcu::TestLog::endSection(section.m_log);
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result.m_message._M_dataplus._M_p != &result.m_message.field_2) {
    operator_delete(result.m_message._M_dataplus._M_p,
                    result.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result.m_prefix._M_dataplus._M_p != &result.m_prefix.field_2) {
    operator_delete(result.m_prefix._M_dataplus._M_p,
                    result.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

ImageBindingLayerCase::IterateResult ImageBindingLayerCase::iterate (void)
{
	glu::CallLogWrapper		gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	int						maxImages	= -1;

	gl.enableLogging(true);

	gl.glGetIntegerv(GL_MAX_IMAGE_UNITS, &maxImages);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "glGetIntegerv");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial value");

		for (int ndx = 0; ndx < maxImages; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_IMAGE_BINDING_LAYER, ndx, 0, m_verifierType);
	}

	{
		const tcu::ScopedLogSection	superSection	(m_testCtx.getLog(), "AfterSetting", "After setting");
		glu::Texture				textureA		(m_context.getRenderContext());
		glu::Texture				textureB		(m_context.getRenderContext());
		const int					ndxA			= 0;
		const int					ndxB			= maxImages / 2;

		gl.glBindTexture(GL_TEXTURE_2D, *textureA);
		gl.glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 32, 32);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "gen tex");

		gl.glBindImageTexture(ndxA, *textureA, 0, GL_FALSE, 0, GL_READ_ONLY, GL_RGBA8UI);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "bind unit");

		gl.glBindTexture(GL_TEXTURE_2D_ARRAY, *textureB);
		gl.glTexStorage3D(GL_TEXTURE_2D_ARRAY, 1, GL_RGBA8, 32, 32, 4);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "gen tex");

		gl.glBindImageTexture(ndxB, *textureB, 0, GL_TRUE, 2, GL_READ_ONLY, GL_RGBA8UI);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "bind unit");

		verifyStateIndexedInteger(result, gl, GL_IMAGE_BINDING_LAYER, ndxA, 0, m_verifierType);
		verifyStateIndexedInteger(result, gl, GL_IMAGE_BINDING_LAYER, ndxB, 2, m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}